

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynUnaryOpType GetUnaryOpType(LexemeType type)

{
  SynUnaryOpType SVar1;
  
  if (type == lex_add) {
    SVar1 = SYN_UNARY_OP_PLUS;
  }
  else if (type == lex_lognot) {
    SVar1 = SYN_UNARY_OP_LOGICAL_NOT;
  }
  else if (type == lex_bitnot) {
    SVar1 = SYN_UNARY_OP_BIT_NOT;
  }
  else {
    if (type != lex_sub) {
      return SYN_UNARY_OP_UNKNOWN;
    }
    SVar1 = SYN_UNARY_OP_NEGATE;
  }
  return SVar1;
}

Assistant:

SynUnaryOpType GetUnaryOpType(LexemeType type)
{
	switch(type)
	{
	case lex_add:
		return SYN_UNARY_OP_PLUS;
	case lex_sub:
		return SYN_UNARY_OP_NEGATE;
	case lex_bitnot:
		return SYN_UNARY_OP_BIT_NOT;
	case lex_lognot:
		return SYN_UNARY_OP_LOGICAL_NOT;
	default:
		break;
	}

	return SYN_UNARY_OP_UNKNOWN;
}